

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.hpp
# Opt level: O2

void __thiscall
InstructionSet::x86::Decoder<(InstructionSet::x86::Model)2>::reset_parsing
          (Decoder<(InstructionSet::x86::Model)2> *this)

{
  this->consumed_ = 0;
  this->operand_bytes_ = 0;
  this->displacement_ = 0;
  this->operand_ = 0;
  this->address_size_ = this->default_address_size_;
  this->data_size_ = this->default_data_size_;
  this->phase_ = Instruction;
  this->source_ = None;
  this->destination_ = None;
  this->next_inward_data_shift_ = 0;
  this->sib_ = '\0';
  this->displacement_size_ = None;
  this->operand_size_ = None;
  this->operation_size_ = None;
  this->inward_data_ = 0;
  this->sign_extend_operand_ = false;
  this->repetition_ = None;
  this->lock_ = false;
  this->segment_override_ = None;
  this->sign_extend_displacement_ = true;
  return;
}

Assistant:

void reset_parsing() {
			consumed_ = operand_bytes_ = 0;
			displacement_size_ = operand_size_ = operation_size_ = DataSize::None;
			displacement_ = operand_ = 0;
			lock_ = false;
			address_size_ = default_address_size_;
			data_size_ = default_data_size_;
			segment_override_ = Source::None;
			repetition_ = Repetition::None;
			phase_ = Phase::Instruction;
			source_ = destination_ = Source::None;
			sib_ = ScaleIndexBase();
			next_inward_data_shift_ = 0;
			inward_data_ = 0;
			sign_extend_operand_ = false;
			sign_extend_displacement_ = true;
		}